

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battle_check.cpp
# Opt level: O1

void dragon_shield_check(int *shield,int *damage)

{
  int iVar1;
  ostream *poVar2;
  
  *shield = *shield - *damage;
  iVar1 = *shield;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,anon_var_dwarf_30a92,0x11);
  if (iVar1 < 0) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*damage + *shield);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,anon_var_dwarf_30a66,0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    *damage = -*shield;
    damage = shield;
  }
  else {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*damage);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,anon_var_dwarf_30a66,0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  *damage = 0;
  return;
}

Assistant:

void dragon_shield_check(int* shield,int* damage){
	*shield -= *damage;
	if(*shield<0){
		cout<<"(龍盾吸收了 "<<*shield + *damage<<" 點傷害)"<<endl;
		*damage = -*shield;
		*shield=0;
	}
	else {
		cout<<"(龍盾吸收了 "<<*damage<<" 點傷害)"<<endl;
		*damage=0;
	}
}